

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_error.h
# Opt level: O2

ostream * jsonnet::internal::operator<<(ostream *o,LocationRange *loc)

{
  Location *loc_00;
  unsigned_long uVar1;
  unsigned_long uVar2;
  ostream *poVar3;
  
  if ((loc->file)._M_string_length != 0) {
    std::operator<<(o,(string *)loc);
  }
  uVar2 = (loc->begin).line;
  if (uVar2 != 0) {
    loc_00 = &loc->begin;
    if ((loc->file)._M_string_length != 0) {
      std::operator<<(o,":");
      uVar2 = loc_00->line;
    }
    if (uVar2 == (loc->end).line) {
      uVar2 = (loc->begin).column;
      uVar1 = (loc->end).column;
      operator<<(o,loc_00);
      if (uVar2 != uVar1 - 1) {
        poVar3 = std::operator<<(o,"-");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      }
    }
    else {
      poVar3 = std::operator<<(o,"(");
      operator<<(poVar3,loc_00);
      poVar3 = std::operator<<(poVar3,")-(");
      operator<<(poVar3,&loc->end);
      std::operator<<(poVar3,")");
    }
  }
  return o;
}

Assistant:

static inline std::ostream &operator<<(std::ostream &o, const LocationRange &loc)
{
    if (loc.file.length() > 0)
        o << loc.file;
    if (loc.isSet()) {
        if (loc.file.length() > 0)
            o << ":";
        if (loc.begin.line == loc.end.line) {
            if (loc.begin.column == loc.end.column - 1) {
                o << loc.begin;
            } else {
                o << loc.begin << "-" << loc.end.column;
            }
        } else {
            o << "(" << loc.begin << ")-(" << loc.end << ")";
        }
    }
    return o;
}